

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O1

void __thiscall perlin::perlin(perlin *this)

{
  int iVar1;
  vec3 *pvVar2;
  int *piVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pvVar2 = (vec3 *)operator_new__(0x1800);
  memset(pvVar2,0,0x1800);
  this->ranvec = pvVar2;
  lVar4 = 0x10;
  do {
    iVar1 = rand();
    dVar7 = (double)iVar1 * 4.656612873077393e-10 + (double)iVar1 * 4.656612873077393e-10 + -1.0;
    iVar1 = rand();
    dVar5 = (double)iVar1 * 4.656612873077393e-10 + (double)iVar1 * 4.656612873077393e-10 + -1.0;
    iVar1 = rand();
    dVar8 = (double)iVar1 * 4.656612873077393e-10 + (double)iVar1 * 4.656612873077393e-10 + -1.0;
    dVar6 = dVar8 * dVar8 + dVar7 * dVar7 + dVar5 * dVar5;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar6 = 1.0 / dVar6;
    pvVar2 = this->ranvec;
    *(double *)((long)pvVar2->e + lVar4 + -0x10) = dVar7 * dVar6;
    *(double *)((long)pvVar2->e + lVar4 + -8) = dVar5 * dVar6;
    *(double *)((long)pvVar2->e + lVar4) = dVar6 * dVar8;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x1810);
  piVar3 = perlin_generate_perm();
  this->perm_x = piVar3;
  piVar3 = perlin_generate_perm();
  this->perm_y = piVar3;
  piVar3 = perlin_generate_perm();
  this->perm_z = piVar3;
  return;
}

Assistant:

perlin() {
        ranvec = new vec3[point_count];
        for (int i = 0; i < point_count; ++i) {
            ranvec[i] = unit_vector(vec3::random(-1, 1));
        }

        perm_x = perlin_generate_perm();
        perm_y = perlin_generate_perm();
        perm_z = perlin_generate_perm();
    }